

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::python::Generator::PrintTopLevelEnums(Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Printer *pPVar3;
  string *value1;
  long *plVar4;
  long lVar5;
  pointer ppVar6;
  FileDescriptor *pFVar7;
  ulong uVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar9;
  EnumDescriptor *enum_descriptor;
  long lVar10;
  ulong uVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  top_level_enum_values;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_80;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_58;
  long local_38;
  
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar7 = this->file_;
  if (0 < *(int *)(pFVar7 + 0x58)) {
    paVar1 = &local_80.first.field_2;
    lVar9 = 0;
    do {
      enum_descriptor = (EnumDescriptor *)(lVar9 * 0x38 + *(long *)(pFVar7 + 0x60));
      local_38 = lVar9;
      PrintEnum(this,enum_descriptor);
      pPVar3 = this->printer_;
      value1 = *(string **)enum_descriptor;
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                (&local_80.first,this,enum_descriptor);
      io::Printer::Print(pPVar3,"$name$ = enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                         "name",value1,"descriptor_name",&local_80.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.first._M_dataplus._M_p,
                        local_80.first.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(this->printer_,"\n");
      if (0 < *(int *)(enum_descriptor + 0x2c)) {
        lVar10 = 0x10;
        lVar9 = 0;
        do {
          plVar4 = *(long **)(*(long *)(enum_descriptor + 0x30) + -0x10 + lVar10);
          iVar2 = *(int *)(*(long *)(enum_descriptor + 0x30) + lVar10);
          lVar5 = *plVar4;
          local_80.first._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>((string *)&local_80,lVar5,plVar4[1] + lVar5);
          local_80.second = iVar2;
          std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::pair<std::__cxx11::string,int>>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)&local_58,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.first._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.first._M_dataplus._M_p,
                            local_80.first.field_2._M_allocated_capacity + 1);
          }
          lVar9 = lVar9 + 1;
          lVar10 = lVar10 + 0x28;
        } while (lVar9 < *(int *)(enum_descriptor + 0x2c));
      }
      lVar9 = local_38 + 1;
      pFVar7 = this->file_;
    } while (lVar9 < *(int *)(pFVar7 + 0x58));
    if (local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_58.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar10 = 0;
      uVar11 = 0;
      do {
        ppVar6 = local_58.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = this->printer_;
        SimpleItoa_abi_cxx11_
                  (&local_80.first,
                   (protobuf *)
                   (ulong)*(uint *)((long)&(local_58.
                                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->second +
                                   lVar10),(int)lVar9);
        io::Printer::Print(pPVar3,"$name$ = $value$\n","name",
                           (string *)((long)&(ppVar6->first)._M_dataplus._M_p + lVar10),"value",
                           &local_80.first);
        lVar9 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.first._M_dataplus._M_p,
                          local_80.first.field_2._M_allocated_capacity + 1);
          lVar9 = extraout_RDX_00;
        }
        uVar11 = uVar11 + 1;
        uVar8 = ((long)local_58.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar10 = lVar10 + 0x28;
      } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
    }
  }
  io::Printer::Print(this->printer_,"\n");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void Generator::PrintTopLevelEnums() const {
  vector<pair<string, int> > top_level_enum_values;
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& enum_descriptor = *file_->enum_type(i);
    PrintEnum(enum_descriptor);
    printer_->Print("$name$ = "
                    "enum_type_wrapper.EnumTypeWrapper($descriptor_name$)",
                    "name", enum_descriptor.name(),
                    "descriptor_name",
                    ModuleLevelDescriptorName(enum_descriptor));
    printer_->Print("\n");

    for (int j = 0; j < enum_descriptor.value_count(); ++j) {
      const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(j);
      top_level_enum_values.push_back(
          make_pair(value_descriptor.name(), value_descriptor.number()));
    }
  }

  for (int i = 0; i < top_level_enum_values.size(); ++i) {
    printer_->Print("$name$ = $value$\n",
                    "name", top_level_enum_values[i].first,
                    "value", SimpleItoa(top_level_enum_values[i].second));
  }
  printer_->Print("\n");
}